

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

CPalThread * AllocTHREAD(void)

{
  CPalThread *val;
  CPalThread *local_10;
  CPalThread *pThread;
  
  CCLock::Enter(&free_threads_spinlock);
  local_10 = Volatile::operator_cast_to_CPalThread_((Volatile *)&free_threads_list);
  if (local_10 != (CPalThread *)0x0) {
    val = CorUnix::CPalThread::GetNext(local_10);
    Volatile<CorUnix::CPalThread_*>::operator=(&free_threads_list,val);
  }
  CCLock::Leave(&free_threads_spinlock);
  if (local_10 == (CPalThread *)0x0) {
    local_10 = CorUnix::InternalNew<CorUnix::CPalThread>();
  }
  else {
    CorUnix::CPalThread::CPalThread(local_10);
  }
  return local_10;
}

Assistant:

CPalThread* AllocTHREAD()
{
    CPalThread* pThread = NULL;

    free_threads_spinlock.Enter();

    pThread = free_threads_list;
    if (pThread != NULL)
    {
        free_threads_list = pThread->GetNext();
    }

    free_threads_spinlock.Leave();

    if (pThread == NULL)
    {
        pThread = InternalNew<CPalThread>();
    }
    else
    {
        pThread = new (pThread) CPalThread;
    }

    return pThread;
}